

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broker.cpp
# Opt level: O2

int main(void)

{
  __sighandler_t __handler;
  int __sig;
  signal<void_(IEvent_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(IEvent_*)>,_boost::function<void_(const_boost::signals2::connection_&,_IEvent_*)>,_boost::signals2::mutex>
  *game;
  Coach c;
  Game g;
  Player p;
  allocator<char> local_79;
  signal<void_(IEvent_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(IEvent_*)>,_boost::function<void_(const_boost::signals2::connection_&,_IEvent_*)>,_boost::signals2::mutex>
  local_78;
  Player local_60;
  string local_30;
  
  Game::Game((Game *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Marcus",&local_79);
  game = &local_78;
  Player::Player(&local_60,&local_30,(Game *)game);
  std::__cxx11::string::~string((string *)&local_30);
  Coach::Coach((Coach *)&local_79,(Game *)game);
  __sig = (int)game;
  Player::score(&local_60);
  Player::score(&local_60);
  Player::score(&local_60);
  Player::score(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  boost::signals2::
  signal<void_(IEvent_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(IEvent_*)>,_boost::function<void_(const_boost::signals2::connection_&,_IEvent_*)>,_boost::signals2::mutex>
  ::~signal(&local_78,__sig,__handler);
  return 0;
}

Assistant:

int main()
{
	Game g;
	Player p{"Marcus", g};
	Coach c{g};
	p.score();
	p.score();
	p.score();
	p.score();

	return 0;
}